

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_normal_attribute_decoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialNormalAttributeDecoder::DecodeIntegerValues
          (SequentialNormalAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  bool bVar1;
  uint16_t uVar2;
  PointCloudDecoder *this_00;
  PointAttribute *in_RDX;
  AttributeOctahedronTransform *in_RSI;
  DecoderBuffer *in_RDI;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *in_stack_00000030;
  SequentialIntegerAttributeDecoder *in_stack_00000038;
  
  this_00 = SequentialAttributeDecoder::decoder((SequentialAttributeDecoder *)in_RDI);
  uVar2 = PointCloudDecoder::bitstream_version(this_00);
  if (uVar2 < 0x200) {
    SequentialAttributeDecoder::attribute((SequentialAttributeDecoder *)in_RDI);
    bVar1 = AttributeOctahedronTransform::DecodeParameters(in_RSI,in_RDX,in_RDI);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = SequentialIntegerAttributeDecoder::DecodeIntegerValues
                    (in_stack_00000038,in_stack_00000030,(DecoderBuffer *)this);
  return bVar1;
}

Assistant:

bool SequentialNormalAttributeDecoder::DecodeIntegerValues(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder()->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    // Note: in older bitstreams, we do not have a PortableAttribute() decoded
    // at this stage so we cannot pass it down to the DecodeParameters() call.
    // It still works fine for octahedral transform because it does not need to
    // use any data from the attribute.
    if (!octahedral_transform_.DecodeParameters(*attribute(), in_buffer)) {
      return false;
    }
  }
#endif
  return SequentialIntegerAttributeDecoder::DecodeIntegerValues(point_ids,
                                                                in_buffer);
}